

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_disp_type_list(int which)

{
  bool bVar1;
  bool bVar2;
  int local_24;
  int c;
  int lwhich;
  int tablen;
  char *style;
  int which_local;
  
  if (which == 1) {
    bVar1 = false;
    bVar2 = true;
    _lwhich = "DT_";
  }
  else {
    bVar2 = which != 2;
    if (bVar2) {
      _lwhich = "ALL";
    }
    else {
      _lwhich = "NIFTI_TYPE_";
    }
    bVar1 = true;
  }
  printf("nifti_type_list entries (%s) :\n  name                    type    nbyper    swapsize\n  ---------------------   ----    ------    --------\n"
         ,_lwhich);
  for (local_24 = 0; local_24 < 0x2b; local_24 = local_24 + 1) {
    if (((bVar2) && (*nifti_type_list[local_24].name == 'D')) ||
       ((bVar1 && (*nifti_type_list[local_24].name == 'N')))) {
      printf("  %-22s %5d     %3d      %5d\n",nifti_type_list[local_24].name,
             (ulong)(uint)nifti_type_list[local_24].type,
             (ulong)(uint)nifti_type_list[local_24].nbyper,
             (ulong)(uint)nifti_type_list[local_24].swapsize);
    }
  }
  return 0;
}

Assistant:

int nifti_disp_type_list( int which )
{
    const char * style;
    int    tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int    lwhich, c;

    if     ( which == 1 ){ lwhich = 1; style = "DT_"; }
    else if( which == 2 ){ lwhich = 2; style = "NIFTI_TYPE_"; }
    else                 { lwhich = 3; style = "ALL"; }

    printf("nifti_type_list entries (%s) :\n"
           "  name                    type    nbyper    swapsize\n"
           "  ---------------------   ----    ------    --------\n", style);

    for( c = 0; c < tablen; c++ )
        if( (lwhich & 1 && nifti_type_list[c].name[0] == 'D')  ||
            (lwhich & 2 && nifti_type_list[c].name[0] == 'N')     )
            printf("  %-22s %5d     %3d      %5d\n",
                   nifti_type_list[c].name,
                   nifti_type_list[c].type,
                   nifti_type_list[c].nbyper,
                   nifti_type_list[c].swapsize);

    return 0;
}